

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int FreeEXRHeader(EXRHeader *exr_header)

{
  int local_1c;
  int i;
  EXRHeader *exr_header_local;
  
  if (exr_header == (EXRHeader *)0x0) {
    exr_header_local._4_4_ = -3;
  }
  else {
    if (exr_header->channels != (EXRChannelInfo *)0x0) {
      free(exr_header->channels);
    }
    if (exr_header->pixel_types != (int *)0x0) {
      free(exr_header->pixel_types);
    }
    if (exr_header->requested_pixel_types != (int *)0x0) {
      free(exr_header->requested_pixel_types);
    }
    for (local_1c = 0; local_1c < exr_header->num_custom_attributes; local_1c = local_1c + 1) {
      if (exr_header->custom_attributes[local_1c].value != (uchar *)0x0) {
        free(exr_header->custom_attributes[local_1c].value);
      }
    }
    if (exr_header->custom_attributes != (EXRAttribute *)0x0) {
      free(exr_header->custom_attributes);
    }
    EXRSetNameAttr(exr_header,(char *)0x0);
    exr_header_local._4_4_ = 0;
  }
  return exr_header_local._4_4_;
}

Assistant:

int FreeEXRHeader(EXRHeader *exr_header) {
  if (exr_header == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->channels) {
    free(exr_header->channels);
  }

  if (exr_header->pixel_types) {
    free(exr_header->pixel_types);
  }

  if (exr_header->requested_pixel_types) {
    free(exr_header->requested_pixel_types);
  }

  for (int i = 0; i < exr_header->num_custom_attributes; i++) {
    if (exr_header->custom_attributes[i].value) {
      free(exr_header->custom_attributes[i].value);
    }
  }

  if (exr_header->custom_attributes) {
    free(exr_header->custom_attributes);
  }

  EXRSetNameAttr(exr_header, NULL);

  return TINYEXR_SUCCESS;
}